

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructGet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructGet *curr)

{
  undefined8 *puVar1;
  long *plVar2;
  ulong uVar3;
  Literal *pLVar4;
  undefined1 local_c8 [8];
  Flow ref;
  undefined8 uStack_78;
  value_type field;
  Literal local_68;
  Literal local_50;
  long local_38;
  shared_ptr<wasm::GCData> data;
  
  visit((Flow *)local_c8,this,*(Expression **)(curr + 0x18));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    Flow::getSingleValue((Flow *)local_c8);
    wasm::Literal::getGCData();
    if (local_38 == 0) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    ref.breakTo.super_IString.str._M_str =
         (char *)Type::getHeapType((Type *)(*(long *)(curr + 0x18) + 8));
    plVar2 = (long *)wasm::HeapType::getStruct();
    uVar3 = (ulong)*(uint *)(curr + 0x10);
    puVar1 = (undefined8 *)(*plVar2 + uVar3 * 0x10);
    uStack_78 = *puVar1;
    _field = puVar1[1];
    pLVar4 = (Literal *)(*(long *)(local_38 + 0x28) + -0x18 + uVar3 * 0x18);
    if (uVar3 == 0) {
      pLVar4 = (Literal *)(local_38 + 0x10);
    }
    wasm::Literal::Literal(&local_50,pLVar4);
    extendForPacking(&local_68,this,&local_50,(Field *)&uStack_78,(bool)curr[0x20]);
    Flow::Flow(__return_storage_ptr__,&local_68);
    wasm::Literal::~Literal(&local_68);
    wasm::Literal::~Literal(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&data);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_c8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_c8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructGet(StructGet* curr) {
    NOTE_ENTER("StructGet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    return extendForPacking(data->values[curr->index], field, curr->signed_);
  }